

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

Gla_Man_t * Gla_ManStart(Gia_Man_t *pGia0,Abs_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  int Entry;
  lit lVar3;
  uint uVar4;
  Gla_Man_t *p_00;
  Vec_Int_t *pVVar5;
  Aig_Man_t *pAig_00;
  Cnf_Dat_t *pCVar6;
  Gia_Man_t *pGVar7;
  int *piVar8;
  int *__s;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  Gla_Obj_t *pGVar11;
  uint *__s_00;
  sat_solver2 *psVar12;
  Vec_Set_t *pVVar13;
  Rnm_Man_t *pRVar14;
  uint uVar15;
  bool bVar16;
  int *pObj2Clause;
  int *pObj2Count;
  int *pLits;
  int *pMapping;
  int local_48;
  int Offset;
  int k;
  int i;
  Vec_Int_t *vMappingNew;
  Gla_Obj_t *pGla;
  Gia_Obj_t *pObj;
  Aig_Man_t *pAig;
  Gla_Man_t *p;
  Abs_Par_t *pPars_local;
  Gia_Man_t *pGia0_local;
  
  p_00 = (Gla_Man_t *)calloc(1,0xd0);
  p_00->pGia0 = pGia0;
  p_00->pPars = pPars;
  pVVar5 = Vec_IntAlloc(100);
  p_00->vAbs = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  p_00->vTemp = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  p_00->vAddedNew = pVVar5;
  pVVar5 = Vec_IntAlloc(100);
  p_00->vObjCounts = pVVar5;
  pAig_00 = Gia_ManToAigSimple(pGia0);
  pCVar6 = Cnf_DeriveOther(pAig_00,1);
  p_00->pCnf = pCVar6;
  Aig_ManStop(pAig_00);
  pGVar7 = Gia_ManDupMapped(pGia0,p_00->pCnf->vMapping);
  p_00->pGia = pGVar7;
  if (pPars->fPropFanout != 0) {
    Gia_ManStaticFanoutStart(p_00->pGia);
  }
  if (pGia0->vGateClasses == (Vec_Int_t *)0x0) {
    __assert_fail("pGia0->vGateClasses != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x355,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
  }
  iVar1 = Gia_ManObjNum(p_00->pGia);
  pVVar5 = Vec_IntStart(iVar1);
  p_00->pGia->vGateClasses = pVVar5;
  iVar1 = Gia_ManObjNum(p_00->pGia);
  pVVar5 = Vec_IntStart(iVar1);
  p_00->vCoreCounts = pVVar5;
  pVVar5 = Vec_IntAlloc(0);
  p_00->vProofIds = pVVar5;
  iVar1 = Gia_ManObjNum(p_00->pGia);
  pVVar5 = Vec_IntStart(iVar1);
  iVar1 = Gia_ManObjNum(p_00->pGia);
  piVar8 = (int *)malloc((long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(p_00->pGia);
  memset(piVar8,0xff,(long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(p_00->pGia);
  __s = (int *)malloc((long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(p_00->pGia);
  memset(__s,0xff,(long)iVar1 << 2);
  Offset = 0;
  do {
    bVar16 = false;
    if (Offset < pGia0->nObjs) {
      pGla = (Gla_Obj_t *)Gia_ManObj(pGia0,Offset);
      bVar16 = pGla != (Gla_Obj_t *)0x0;
    }
    if (!bVar16) {
      Vec_IntFree(p_00->pCnf->vMapping);
      p_00->pCnf->vMapping = pVVar5;
      if (p_00->pCnf->pObj2Count != (int *)0x0) {
        free(p_00->pCnf->pObj2Count);
        p_00->pCnf->pObj2Count = (int *)0x0;
      }
      p_00->pCnf->pObj2Count = piVar8;
      if (p_00->pCnf->pObj2Clause != (int *)0x0) {
        free(p_00->pCnf->pObj2Clause);
        p_00->pCnf->pObj2Clause = (int *)0x0;
      }
      p_00->pCnf->pObj2Clause = __s;
      p_00->nObjs = 1;
      Offset = 0;
      while( true ) {
        bVar16 = false;
        if (Offset < p_00->pGia->nObjs) {
          pGla = (Gla_Obj_t *)Gia_ManObj(p_00->pGia,Offset);
          bVar16 = pGla != (Gla_Obj_t *)0x0;
        }
        if (!bVar16) break;
        if (p_00->pCnf->pObj2Count[Offset] < 0) {
          pGla->Fanins[0] = -1;
        }
        else {
          iVar1 = p_00->nObjs;
          p_00->nObjs = iVar1 + 1;
          pGla->Fanins[0] = iVar1;
        }
        Offset = Offset + 1;
      }
      piVar8 = *p_00->pCnf->pClauses;
      Offset = 0;
      while( true ) {
        if (p_00->pCnf->nLiterals <= Offset) {
          pGVar11 = (Gla_Obj_t *)calloc((long)p_00->nObjs,0x28);
          p_00->pObjs = pGVar11;
          iVar1 = Gia_ManObjNum(p_00->pGia);
          __s_00 = (uint *)malloc((long)iVar1 << 2);
          iVar1 = Gia_ManObjNum(p_00->pGia);
          memset(__s_00,0xff,(long)iVar1 << 2);
          p_00->pObj2Obj = __s_00;
          Offset = 0;
          while( true ) {
            bVar16 = false;
            if (Offset < p_00->pGia->nObjs) {
              pGla = (Gla_Obj_t *)Gia_ManObj(p_00->pGia,Offset);
              bVar16 = pGla != (Gla_Obj_t *)0x0;
            }
            if (!bVar16) break;
            p_00->pObj2Obj[Offset] = pGla->Fanins[0];
            if (pGla->Fanins[0] != -1) {
              pGVar11 = Gla_ManObj(p_00,pGla->Fanins[0]);
              pGVar11->iGiaObj = Offset;
              uVar4 = Gia_ObjFaninC0((Gia_Obj_t *)pGla);
              *(uint *)&pGVar11->field_0x4 =
                   *(uint *)&pGVar11->field_0x4 & 0xfffffffd | (uVar4 & 1) << 1;
              uVar4 = Gia_ObjIsConst0((Gia_Obj_t *)pGla);
              *(uint *)&pGVar11->field_0x4 =
                   *(uint *)&pGVar11->field_0x4 & 0xfffffffb | (uVar4 & 1) << 2;
              uVar4 = Gia_ObjIsPi(p_00->pGia,(Gia_Obj_t *)pGla);
              *(uint *)&pGVar11->field_0x4 =
                   *(uint *)&pGVar11->field_0x4 & 0xfffffff7 | (uVar4 & 1) << 3;
              uVar4 = Gia_ObjIsPo(p_00->pGia,(Gia_Obj_t *)pGla);
              *(uint *)&pGVar11->field_0x4 =
                   *(uint *)&pGVar11->field_0x4 & 0xffffffef | (uVar4 & 1) << 4;
              uVar4 = Gia_ObjIsRi(p_00->pGia,(Gia_Obj_t *)pGla);
              *(uint *)&pGVar11->field_0x4 =
                   *(uint *)&pGVar11->field_0x4 & 0xffffffbf | (uVar4 & 1) << 6;
              uVar4 = Gia_ObjIsRo(p_00->pGia,(Gia_Obj_t *)pGla);
              *(uint *)&pGVar11->field_0x4 =
                   *(uint *)&pGVar11->field_0x4 & 0xffffffdf | (uVar4 & 1) << 5;
              uVar4 = Gia_ObjIsAnd((Gia_Obj_t *)pGla);
              *(uint *)&pGVar11->field_0x4 =
                   *(uint *)&pGVar11->field_0x4 & 0xffffff7f | (uVar4 & 1) << 7;
              iVar1 = Gia_ObjIsConst0((Gia_Obj_t *)pGla);
              if ((iVar1 == 0) && (iVar1 = Gia_ObjIsPi(p_00->pGia,(Gia_Obj_t *)pGla), iVar1 == 0)) {
                iVar1 = Gia_ObjIsCo((Gia_Obj_t *)pGla);
                if (iVar1 == 0) {
                  iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)pGla);
                  if (iVar1 == 0) {
                    iVar1 = Gia_ObjIsRo(p_00->pGia,(Gia_Obj_t *)pGla);
                    if (iVar1 == 0) {
                      __assert_fail("Gia_ObjIsRo(p->pGia, pObj)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                                    ,0x3bf,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
                    }
                    *(uint *)&pGVar11->field_0x4 = *(uint *)&pGVar11->field_0x4 & 0x1ff | 0x200;
                    pGVar10 = Gia_ObjRoToRi(p_00->pGia,(Gia_Obj_t *)pGla);
                    pGVar10 = Gia_ObjFanin0(pGVar10);
                    pGVar11->Fanins[0] = pGVar10->Value;
                    pGVar10 = Gia_ObjRoToRi(p_00->pGia,(Gia_Obj_t *)pGla);
                    uVar4 = Gia_ObjFaninC0(pGVar10);
                    *(uint *)&pGVar11->field_0x4 =
                         *(uint *)&pGVar11->field_0x4 & 0xfffffffd | (uVar4 & 1) << 1;
                  }
                  else {
                    iVar1 = Vec_IntEntry(p_00->pCnf->vMapping,Offset);
                    piVar8 = Vec_IntEntryP(p_00->pCnf->vMapping,iVar1);
                    *(uint *)&pGVar11->field_0x4 = *(uint *)&pGVar11->field_0x4 & 0x1ff;
                    for (local_48 = 1; local_48 < 5; local_48 = local_48 + 1) {
                      if (piVar8[local_48] != -1) {
                        pGVar10 = Gia_ManObj(p_00->pGia,piVar8[local_48]);
                        uVar4 = pGVar10->Value;
                        uVar15 = *(uint *)&pGVar11->field_0x4 >> 9;
                        *(uint *)&pGVar11->field_0x4 =
                             *(uint *)&pGVar11->field_0x4 & 0x1ff | (uVar15 + 1) * 0x200;
                        pGVar11->Fanins[uVar15] = uVar4;
                      }
                    }
                  }
                }
                else {
                  *(uint *)&pGVar11->field_0x4 = *(uint *)&pGVar11->field_0x4 & 0x1ff | 0x200;
                  pGVar10 = Gia_ObjFanin0((Gia_Obj_t *)pGla);
                  pGVar11->Fanins[0] = pGVar10->Value;
                }
              }
            }
            Offset = Offset + 1;
          }
          pGVar10 = Gia_ManPo(p_00->pGia,0);
          pGVar11 = Gla_ManObj(p_00,pGVar10->Value);
          p_00->pObjRoot = pGVar11;
          if (p_00->pGia->vGateClasses == (Vec_Int_t *)0x0) {
            __assert_fail("p->pGia->vGateClasses != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                          ,0x3c6,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
          }
          vMappingNew = (Vec_Int_t *)p_00->pObjs;
          while (pGVar11 = (Gla_Obj_t *)vMappingNew, vMappingNew = (Vec_Int_t *)(pGVar11 + 1),
                vMappingNew < p_00->pObjs + p_00->nObjs) {
            iVar1 = Vec_IntEntry(p_00->pGia->vGateClasses,vMappingNew->nCap);
            if (iVar1 != 0) {
              *(uint *)&pGVar11[1].field_0x4 = *(uint *)&pGVar11[1].field_0x4 & 0xfffffffe | 1;
              pVVar5 = p_00->vAbs;
              iVar1 = Gla_ObjId(p_00,(Gla_Obj_t *)vMappingNew);
              Vec_IntPush(pVVar5,iVar1);
            }
          }
          psVar12 = sat_solver2_new();
          p_00->pSat = psVar12;
          if (pPars->fUseFullProof != 0) {
            pVVar13 = Vec_SetAlloc(0x14);
            p_00->pSat->pPrf1 = pVVar13;
          }
          p_00->pSat->nLearntStart = p_00->pPars->nLearnedStart;
          p_00->pSat->nLearntDelta = p_00->pPars->nLearnedDelta;
          p_00->pSat->nLearntRatio = p_00->pPars->nLearnedPerce;
          p_00->pSat->nLearntMax = p_00->pSat->nLearntStart;
          p_00->nSatVars = 1;
          pRVar14 = Rnm_ManStart(p_00->pGia);
          p_00->pRnm = pRVar14;
          return p_00;
        }
        iVar1 = lit_var(piVar8[Offset]);
        pGVar10 = Gia_ManObj(pGia0,iVar1);
        if (pGVar10->Value == 0xffffffff) {
          __assert_fail("~pObj->Value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x390,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
        }
        pGla = (Gla_Obj_t *)Gia_ManObj(p_00->pGia,pGVar10->Value);
        if (pGla->Fanins[0] == 0xffffffff) break;
        uVar4 = pGla->Fanins[0];
        iVar1 = lit_sign(piVar8[Offset]);
        lVar3 = toLitCond(uVar4,iVar1);
        piVar8[Offset] = lVar3;
        Offset = Offset + 1;
      }
      __assert_fail("~pObj->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                    ,0x393,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
    }
    if (pGla->Fanins[0] != -1) {
      iVar1 = Abc_LitIsCompl(pGla->Fanins[0]);
      if (iVar1 != 0) {
        __assert_fail("!Abc_LitIsCompl(pObj->Value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x364,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
      }
      iVar1 = Abc_Lit2Var(pGla->Fanins[0]);
      pGla->Fanins[0] = iVar1;
      iVar1 = pGla->Fanins[0];
      iVar2 = Gia_ManObjNum(p_00->pGia);
      if (iVar2 <= iVar1) {
        __assert_fail("(int)pObj->Value < Gia_ManObjNum(p->pGia)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x366,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
      }
      piVar8[(uint)pGla->Fanins[0]] = p_00->pCnf->pObj2Count[Offset];
      __s[(uint)pGla->Fanins[0]] = p_00->pCnf->pObj2Clause[Offset];
      iVar1 = Vec_IntEntry(pGia0->vGateClasses,Offset);
      if (iVar1 != 0) {
        Vec_IntWriteEntry(p_00->pGia->vGateClasses,pGla->Fanins[0],1);
      }
      iVar2 = Vec_IntEntry(p_00->pCnf->vMapping,Offset);
      iVar1 = pGla->Fanins[0];
      Entry = Vec_IntSize(pVVar5);
      Vec_IntWriteEntry(pVVar5,iVar1,Entry);
      piVar9 = Vec_IntEntryP(p_00->pCnf->vMapping,iVar2);
      Vec_IntPush(pVVar5,*piVar9);
      for (local_48 = 1; local_48 < 5; local_48 = local_48 + 1) {
        if (piVar9[local_48] == -1) {
          Vec_IntPush(pVVar5,-1);
        }
        else {
          pGVar10 = Gia_ManObj(pGia0,piVar9[local_48]);
          if (pGVar10->Value == 0xffffffff) {
            __assert_fail("~Gia_ManObj(pGia0, pMapping[k])->Value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                          ,0x377,"Gla_Man_t *Gla_ManStart(Gia_Man_t *, Abs_Par_t *)");
          }
          pGVar10 = Gia_ManObj(pGia0,piVar9[local_48]);
          Vec_IntPush(pVVar5,pGVar10->Value);
        }
      }
    }
    Offset = Offset + 1;
  } while( true );
}

Assistant:

Gla_Man_t * Gla_ManStart( Gia_Man_t * pGia0, Abs_Par_t * pPars )
{
    Gla_Man_t * p;
    Aig_Man_t * pAig;
    Gia_Obj_t * pObj;
    Gla_Obj_t * pGla;
    Vec_Int_t * vMappingNew;
    int i, k, Offset, * pMapping, * pLits, * pObj2Count, * pObj2Clause;

    // start
    p = ABC_CALLOC( Gla_Man_t, 1 );
    p->pGia0 = pGia0;
    p->pPars = pPars;
    p->vAbs  = Vec_IntAlloc( 100 );
    p->vTemp = Vec_IntAlloc( 100 );
    p->vAddedNew = Vec_IntAlloc( 100 );
    p->vObjCounts = Vec_IntAlloc( 100 );

    // internal data
    pAig = Gia_ManToAigSimple( pGia0 );
    p->pCnf = Cnf_DeriveOther( pAig, 1 );
    Aig_ManStop( pAig );
    // create working GIA
    p->pGia = Gia_ManDupMapped( pGia0, p->pCnf->vMapping );
    if ( pPars->fPropFanout )
        Gia_ManStaticFanoutStart( p->pGia );

    // derive new gate map
    assert( pGia0->vGateClasses != 0 );
    p->pGia->vGateClasses = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    p->vCoreCounts = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    p->vProofIds = Vec_IntAlloc(0);
    // update p->pCnf->vMapping, p->pCnf->pObj2Count, p->pCnf->pObj2Clause 
    // (here are not updating p->pCnf->pVarNums because it is not needed)
    vMappingNew = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    pObj2Count  = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
    pObj2Clause = ABC_FALLOC( int, Gia_ManObjNum(p->pGia) );
    Gia_ManForEachObj( pGia0, pObj, i )
    {
        // skip internal nodes not used in the mapping
        if ( !~pObj->Value )
            continue;
        // replace positive literal by variable
        assert( !Abc_LitIsCompl(pObj->Value) );
        pObj->Value = Abc_Lit2Var(pObj->Value);
        assert( (int)pObj->Value < Gia_ManObjNum(p->pGia) );
        // update arrays
        pObj2Count[pObj->Value] = p->pCnf->pObj2Count[i];
        pObj2Clause[pObj->Value] = p->pCnf->pObj2Clause[i];
        if ( Vec_IntEntry(pGia0->vGateClasses, i) )
            Vec_IntWriteEntry( p->pGia->vGateClasses, pObj->Value, 1 );
        // update mappings
        Offset = Vec_IntEntry(p->pCnf->vMapping, i);
        Vec_IntWriteEntry( vMappingNew, pObj->Value, Vec_IntSize(vMappingNew) );
        pMapping = Vec_IntEntryP(p->pCnf->vMapping, Offset);
        Vec_IntPush( vMappingNew, pMapping[0] );
        for ( k = 1; k <= 4; k++ )
        {
            if ( pMapping[k] == -1 )
                Vec_IntPush( vMappingNew, -1 );
            else
            {
                assert( ~Gia_ManObj(pGia0, pMapping[k])->Value );
                Vec_IntPush( vMappingNew, Gia_ManObj(pGia0, pMapping[k])->Value );
            }
        }
    }
    // update mapping after the offset (currently not being done because it is not used)
    Vec_IntFree( p->pCnf->vMapping );  p->pCnf->vMapping    = vMappingNew;
    ABC_FREE( p->pCnf->pObj2Count );   p->pCnf->pObj2Count  = pObj2Count;
    ABC_FREE( p->pCnf->pObj2Clause );  p->pCnf->pObj2Clause = pObj2Clause;


    // count the number of variables
    p->nObjs = 1;
    Gia_ManForEachObj( p->pGia, pObj, i )
        if ( p->pCnf->pObj2Count[i] >= 0 )
            pObj->Value = p->nObjs++;
        else
            pObj->Value = ~0;

    // re-express CNF using new variable IDs
    pLits = p->pCnf->pClauses[0];
    for ( i = 0; i < p->pCnf->nLiterals; i++ )
    {
        // find the original AIG object
        pObj = Gia_ManObj( pGia0, lit_var(pLits[i]) );
        assert( ~pObj->Value );
        // find the working AIG object
        pObj = Gia_ManObj( p->pGia, pObj->Value );
        assert( ~pObj->Value );
        // express literal in terms of LUT variables
        pLits[i] = toLitCond( pObj->Value, lit_sign(pLits[i]) );
    }

    // create objects 
    p->pObjs    = ABC_CALLOC( Gla_Obj_t, p->nObjs );
    p->pObj2Obj = ABC_FALLOC( unsigned, Gia_ManObjNum(p->pGia) );
//    p->pvRefis  = ABC_CALLOC( Vec_Int_t, Gia_ManObjNum(p->pGia) );
    Gia_ManForEachObj( p->pGia, pObj, i )
    {
        p->pObj2Obj[i] = pObj->Value;
        if ( !~pObj->Value )
            continue;
        pGla = Gla_ManObj( p, pObj->Value );
        pGla->iGiaObj = i;
        pGla->fCompl0 = Gia_ObjFaninC0(pObj);
        pGla->fConst  = Gia_ObjIsConst0(pObj);
        pGla->fPi     = Gia_ObjIsPi(p->pGia, pObj);
        pGla->fPo     = Gia_ObjIsPo(p->pGia, pObj);
        pGla->fRi     = Gia_ObjIsRi(p->pGia, pObj);
        pGla->fRo     = Gia_ObjIsRo(p->pGia, pObj);
        pGla->fAnd    = Gia_ObjIsAnd(pObj);
        if ( Gia_ObjIsConst0(pObj) || Gia_ObjIsPi(p->pGia, pObj) )
            continue;
        if ( Gia_ObjIsCo(pObj) )
        {
            pGla->nFanins = 1;
            pGla->Fanins[0] = Gia_ObjFanin0(pObj)->Value;
            continue;
        }
        if ( Gia_ObjIsAnd(pObj) )
        {
//            Gla_ManCollectFanins( p, pGla, pObj->Value, p->vTemp );
//            pGla->nFanins = Vec_IntSize( p->vTemp );
//            memcpy( pGla->Fanins, Vec_IntArray(p->vTemp), sizeof(int) * Vec_IntSize(p->vTemp) );
            Offset = Vec_IntEntry( p->pCnf->vMapping, i );
            pMapping = Vec_IntEntryP( p->pCnf->vMapping, Offset );
            pGla->nFanins = 0;
            for ( k = 1; k <= 4; k++ )
                if ( pMapping[k] != -1 )
                    pGla->Fanins[ pGla->nFanins++ ] = Gia_ManObj(p->pGia, pMapping[k])->Value;
            continue;
        }
        assert( Gia_ObjIsRo(p->pGia, pObj) );
        pGla->nFanins   = 1;
        pGla->Fanins[0] = Gia_ObjFanin0( Gia_ObjRoToRi(p->pGia, pObj) )->Value;
        pGla->fCompl0   = Gia_ObjFaninC0( Gia_ObjRoToRi(p->pGia, pObj) );
    }
    p->pObjRoot = Gla_ManObj( p, Gia_ManPo(p->pGia, 0)->Value );
    // abstraction 
    assert( p->pGia->vGateClasses != NULL );
    Gla_ManForEachObj( p, pGla )
    {
        if ( Vec_IntEntry( p->pGia->vGateClasses, pGla->iGiaObj ) == 0 )
            continue;
        pGla->fAbs = 1;
        Vec_IntPush( p->vAbs, Gla_ObjId(p, pGla) );
    }
    // other 
    p->pSat        = sat_solver2_new();
    if ( pPars->fUseFullProof )
        p->pSat->pPrf1 = Vec_SetAlloc( 20 );
//    p->pSat->fVerbose = p->pPars->fVerbose;
//    sat_solver2_set_learntmax( p->pSat, pPars->nLearnedMax );
    p->pSat->nLearntStart = p->pPars->nLearnedStart;
    p->pSat->nLearntDelta = p->pPars->nLearnedDelta;
    p->pSat->nLearntRatio = p->pPars->nLearnedPerce;
    p->pSat->nLearntMax   = p->pSat->nLearntStart;
    p->nSatVars  = 1;
    // start the refinement manager
//    p->pGia2 = Gia_ManDup( p->pGia );
    p->pRnm = Rnm_ManStart( p->pGia );
    return p;
}